

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O2

type __thiscall
PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)2>
          (Memory *this,Source segment,uint16_t offset)

{
  uint32_t address;
  uint32_t uVar1;
  type puVar2;
  undefined2 in_register_00000012;
  
  address = Memory::address(this,segment,offset);
  if (CONCAT22(in_register_00000012,offset) != 0xffff) {
    puVar2 = access<unsigned_short,(InstructionSet::x86::AccessType)2>(this,address);
    return puVar2;
  }
  uVar1 = segment_base(this,segment);
  this->write_back_address_[0] = address;
  this->write_back_address_[1] = uVar1 & 0xfffff;
  this->write_back_value_ =
       CONCAT11((this->memory)._M_elems[uVar1 & 0xfffff],(this->memory)._M_elems[address]);
  return &this->write_back_value_;
}

Assistant:

typename InstructionSet::x86::Accessor<IntT, type>::type access(InstructionSet::x86::Source segment, uint16_t offset) {
			const uint32_t physical_address = address(segment, offset);

			if constexpr (std::is_same_v<IntT, uint16_t>) {
				// If this is a 16-bit access that runs past the end of the segment, it'll wrap back
				// to the start. So the 16-bit value will need to be a local cache.
				if(offset == 0xffff) {
					return split_word<type>(physical_address, address(segment, 0));
				}
			}

			return access<IntT, type>(physical_address);
		}